

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O2

int fl_ascii_strcasecmp(char *s,char *t)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  if (t == (char *)0x0 || s == (char *)0x0) {
    bVar5 = s == (char *)0x0;
    bVar6 = s == t;
  }
  else {
    lVar4 = 0;
    while( true ) {
      cVar1 = s[lVar4];
      cVar2 = t[lVar4];
      if ((cVar1 == '\0') || (cVar2 == '\0')) break;
      if (cVar1 != cVar2) {
        if (cVar1 < cVar2) {
          if ((0x19 < (byte)(cVar1 + 0xbfU)) || (cVar1 + 0x20 != (int)cVar2)) {
            return -1;
          }
        }
        else {
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            return 1;
          }
          if (cVar1 + -0x20 != (int)cVar2) {
            return 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
    }
    bVar5 = cVar2 != '\0';
    bVar6 = cVar1 == cVar2;
  }
  uVar3 = -(uint)bVar5 | 1;
  if (bVar6) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int fl_ascii_strcasecmp(const char *s, const char *t) {
  if (!s || !t) return (s==t ? 0 : (!s ? -1 : +1));
  
  for(;*s && *t; s++,t++) {
    if (*s == *t) continue;
    if (*s < *t) {
      if ( (*s+0x20)!=*t || !C_RANGE(*s,'A','Z') ) return -1;
    } else { 	/* (*s > *t) */
      if ( (*s-0x20)!=*t || !C_RANGE(*s,'a','z') ) return +1;
    }
  }
  return (*s==*t) ? 0 : (*t ? -1 : +1);
}